

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int get_this_mv(int_mv *this_mv,PREDICTION_MODE this_mode,int ref_idx,int ref_mv_idx,
               int skip_repeated_ref_mv,MV_REFERENCE_FRAME *ref_frame,MB_MODE_INFO_EXT *mbmi_ext)

{
  PREDICTION_MODE single_mode;
  byte bVar1;
  int iVar2;
  int_mv iVar3;
  int_mv *piVar4;
  undefined1 *puVar5;
  undefined7 in_register_00000031;
  
  puVar5 = compound_ref0_mode_lut;
  if (ref_idx != 0) {
    puVar5 = compound_ref1_mode_lut;
  }
  single_mode = puVar5[CONCAT71(in_register_00000031,this_mode) & 0xffffffff];
  if (single_mode == '\x10') {
    iVar3.as_int = 0x80008000;
  }
  else {
    if (single_mode == '\x0f') {
      if ((skip_repeated_ref_mv != 0) &&
         (iVar2 = check_repeat_ref_mv(mbmi_ext,ref_idx,ref_frame,'\x0f'), iVar2 != 0)) {
        return 0;
      }
      piVar4 = mbmi_ext->global_mvs + ref_frame[(uint)ref_idx];
    }
    else {
      bVar1 = av1_ref_frame_type(ref_frame);
      iVar2 = 0;
      if (single_mode != '\r') {
        iVar2 = ref_mv_idx + 1;
      }
      if (iVar2 < (int)(uint)mbmi_ext->ref_mv_count[bVar1]) {
        if (ref_idx == 0) {
          piVar4 = &mbmi_ext->ref_mv_stack[bVar1][iVar2].this_mv;
        }
        else {
          piVar4 = &mbmi_ext->ref_mv_stack[bVar1][iVar2].comp_mv;
        }
      }
      else {
        if ((skip_repeated_ref_mv != 0) &&
           (iVar2 = check_repeat_ref_mv(mbmi_ext,ref_idx,ref_frame,single_mode), iVar2 != 0)) {
          return 0;
        }
        piVar4 = mbmi_ext->global_mvs + ref_frame[(uint)ref_idx];
      }
    }
    iVar3 = *piVar4;
  }
  *this_mv = iVar3;
  return 1;
}

Assistant:

static inline int get_this_mv(int_mv *this_mv, PREDICTION_MODE this_mode,
                              int ref_idx, int ref_mv_idx,
                              int skip_repeated_ref_mv,
                              const MV_REFERENCE_FRAME *ref_frame,
                              const MB_MODE_INFO_EXT *mbmi_ext) {
  const PREDICTION_MODE single_mode = get_single_mode(this_mode, ref_idx);
  assert(is_inter_singleref_mode(single_mode));
  if (single_mode == NEWMV) {
    this_mv->as_int = INVALID_MV;
  } else if (single_mode == GLOBALMV) {
    if (skip_repeated_ref_mv &&
        check_repeat_ref_mv(mbmi_ext, ref_idx, ref_frame, single_mode))
      return 0;
    *this_mv = mbmi_ext->global_mvs[ref_frame[ref_idx]];
  } else {
    assert(single_mode == NEARMV || single_mode == NEARESTMV);
    const uint8_t ref_frame_type = av1_ref_frame_type(ref_frame);
    const int ref_mv_offset = single_mode == NEARESTMV ? 0 : ref_mv_idx + 1;
    if (ref_mv_offset < mbmi_ext->ref_mv_count[ref_frame_type]) {
      assert(ref_mv_offset >= 0);
      if (ref_idx == 0) {
        *this_mv =
            mbmi_ext->ref_mv_stack[ref_frame_type][ref_mv_offset].this_mv;
      } else {
        *this_mv =
            mbmi_ext->ref_mv_stack[ref_frame_type][ref_mv_offset].comp_mv;
      }
    } else {
      if (skip_repeated_ref_mv &&
          check_repeat_ref_mv(mbmi_ext, ref_idx, ref_frame, single_mode))
        return 0;
      *this_mv = mbmi_ext->global_mvs[ref_frame[ref_idx]];
    }
  }
  return 1;
}